

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O0

void purge(h2o_cache_t *cache,uint64_t now)

{
  int iVar1;
  khint_t kVar2;
  st_h2o_linklist_t **ref;
  int64_t iVar3;
  h2o_cache_ref_t *oldest;
  h2o_cache_ref_t *last;
  uint64_t now_local;
  h2o_cache_t *cache_local;
  
  while (cache->capacity < cache->size) {
    iVar1 = h2o_linklist_is_empty(&cache->lru);
    if (iVar1 != 0) {
      __assert_fail("!h2o_linklist_is_empty(&cache->lru)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/cache.c"
                    ,0x5c,"void purge(h2o_cache_t *, uint64_t)");
    }
    kVar2 = kh_get_cache(cache->table,(h2o_cache_ref_t *)&(cache->lru).next[-4].prev);
    erase_ref(cache,kVar2,0);
  }
  while( true ) {
    iVar1 = h2o_linklist_is_empty(&cache->age);
    if (iVar1 != 0) {
      return;
    }
    ref = &(cache->age).next[-5].prev;
    iVar3 = get_timeleft(cache,(h2o_cache_ref_t *)ref,now);
    if (-1 < iVar3) break;
    kVar2 = kh_get_cache(cache->table,(h2o_cache_ref_t *)ref);
    erase_ref(cache,kVar2,0);
  }
  return;
}

Assistant:

static void purge(h2o_cache_t *cache, uint64_t now)
{
    /* by cache size */
    while (cache->capacity < cache->size) {
        h2o_cache_ref_t *last;
        assert(!h2o_linklist_is_empty(&cache->lru));
        last = H2O_STRUCT_FROM_MEMBER(h2o_cache_ref_t, _lru_link, cache->lru.next);
        erase_ref(cache, kh_get(cache, cache->table, last), 0);
    }
    /* by TTL */
    while (!h2o_linklist_is_empty(&cache->age)) {
        h2o_cache_ref_t *oldest = H2O_STRUCT_FROM_MEMBER(h2o_cache_ref_t, _age_link, cache->age.next);
        if (get_timeleft(cache, oldest, now) >= 0)
            break;
        erase_ref(cache, kh_get(cache, cache->table, oldest), 0);
    }
}